

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O2

void __thiscall TRM::SWRaster::render_quad_to(SWRaster *this,float cx,float cy,float x2,float y2)

{
  int iVar1;
  unsigned_long uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  array<glm::vec<2,_int,_(glm::qualifier)0>,_97UL> *paVar10;
  int32_t to_x;
  float fVar11;
  
  fVar11 = (float)up_scale<float>(float)::scale;
  to_x = (int32_t)(x2 * fVar11);
  (this->m_bez_stack)._M_elems[0].field_0.x = to_x;
  (this->m_bez_stack)._M_elems[0].field_1.y = (int)(y2 * fVar11);
  (this->m_bez_stack)._M_elems[1].field_0.x = (int)(cx * fVar11);
  (this->m_bez_stack)._M_elems[1].field_1.y = (int)(cy * fVar11);
  iVar1 = this->m_y;
  uVar6 = to_x + (int)(cx * fVar11) * -2 + this->m_x;
  uVar4 = -uVar6;
  if (0 < (int)uVar6) {
    uVar4 = uVar6;
  }
  uVar7 = (int)(y2 * fVar11) + (int)(cy * fVar11) * -2 + iVar1;
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  paVar10 = &this->m_bez_stack;
  if (uVar6 < uVar4) {
    uVar6 = uVar4;
  }
  (this->m_bez_stack)._M_elems[2].field_0.x = this->m_x;
  (this->m_bez_stack)._M_elems[2].field_1.y = iVar1;
  uVar4 = 0;
  if (uVar6 < 0x40) goto LAB_001112f8;
  uVar2 = 0;
  uVar3 = (ulong)uVar6;
  do {
    uVar2 = uVar2 + 1;
    uVar4 = (uint)uVar3;
    uVar3 = uVar3 >> 2;
  } while (0x103 < uVar4);
  (this->m_lev_stack)._M_elems[0] = uVar2;
  uVar3 = 0;
  do {
    iVar1 = paVar10->_M_elems[2].field_0.x;
    paVar10->_M_elems[4].field_0.x = iVar1;
    iVar5 = paVar10->_M_elems[1].field_0.x;
    iVar8 = paVar10->_M_elems[1].field_1.y;
    iVar9 = paVar10->_M_elems[0].field_0.x + iVar5;
    iVar5 = iVar5 + iVar1;
    paVar10->_M_elems[3].field_0.x = iVar5 >> 1;
    paVar10->_M_elems[2].field_0.x = iVar9 + iVar5 >> 2;
    paVar10->_M_elems[1].field_0.x = iVar9 >> 1;
    iVar1 = paVar10->_M_elems[2].field_1.y;
    paVar10->_M_elems[4].field_1.y = iVar1;
    iVar5 = paVar10->_M_elems[0].field_1.y + iVar8;
    iVar8 = iVar8 + iVar1;
    paVar10->_M_elems[3].field_1.y = iVar8 >> 1;
    paVar10->_M_elems[2].field_1.y = iVar5 + iVar8 >> 2;
    paVar10->_M_elems[1].field_1.y = iVar5 >> 1;
    paVar10 = (array<glm::vec<2,_int,_(glm::qualifier)0>,_97UL> *)(paVar10->_M_elems + 2);
    uVar4 = (int)uVar3 + 1;
    (this->m_lev_stack)._M_elems[uVar3] = uVar2 - 1;
    (this->m_lev_stack)._M_elems[uVar3 + 1] = uVar2 - 1;
    while( true ) {
      uVar3 = (ulong)uVar4;
      if ((int)uVar4 < 0) {
        return;
      }
      uVar2 = (this->m_lev_stack)._M_elems[uVar3];
      if (uVar2 != 0) break;
      to_x = paVar10->_M_elems[0].field_0.x;
LAB_001112f8:
      render_line(this,to_x,
                  ((anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 *)
                  (&paVar10->_M_elems[0].field_0 + 1))->y);
      uVar4 = uVar4 - 1;
      paVar10 = (array<glm::vec<2,_int,_(glm::qualifier)0>,_97UL> *)((long)(paVar10 + -1) + 0x2f8);
    }
  } while( true );
}

Assistant:

void SWRaster::render_quad_to(float cx, float cy, float x2, float y2) {
  auto levels = m_lev_stack.data();
  auto arc = m_bez_stack.data();
  size_t level = 0;
  int32_t min, max, y;

  arc[0].x = up_scale(x2);
  arc[0].y = up_scale(y2);
  arc[1].x = up_scale(cx);
  arc[1].y = up_scale(cy);
  arc[2].x = m_x;
  arc[2].y = m_y;
  int32_t top = 0;

  int32_t dx = std::abs(arc[2].x + arc[0].x - 2 * arc[1].x);
  int32_t dy = std::abs(arc[2].y + arc[0].y - 2 * arc[1].y);

  if (dx < dy) {
    dx = dy;
  }

  if (dx < ONE_PIXEL / 4) {
    goto DRAW;
  }

  level = 0;
  do {
    dx >>= 2;
    level++;
  } while (dx > ONE_PIXEL / 4);

  levels[0] = level;

  do {
    level = levels[top];
    if (level > 0) {
      sw_split_conic(arc);
      arc += 2;
      top++;
      levels[top] = levels[top - 1] = level - 1;
      continue;
    }
  DRAW:
    render_line(arc[0].x, arc[0].y);
    top--;
    arc -= 2;
  } while (top >= 0);
}